

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O0

void __thiscall FIX::Exception::Exception(Exception *this,string *t,string *d)

{
  long lVar1;
  bool local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *d_local;
  string *t_local;
  Exception *this_local;
  
  local_20 = d;
  d_local = t;
  t_local = (string *)this;
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    std::__cxx11::string::string((string *)&local_40,(string *)d_local);
  }
  else {
    std::operator+(&local_60,d_local,": ");
    std::operator+(&local_40,&local_60,local_20);
  }
  local_61 = lVar1 != 0;
  std::logic_error::logic_error(&this->super_logic_error,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (local_61) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  *(undefined ***)this = &PTR__Exception_001ad818;
  std::__cxx11::string::string((string *)&this->type,(string *)d_local);
  std::__cxx11::string::string((string *)&this->detail,(string *)local_20);
  return;
}

Assistant:

Exception( const std::string& t, const std::string& d )
  : std::logic_error( d.size() ? t + ": " + d : t ),
    type( t ), detail( d )
  {}